

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O3

zt_mem_pool * zt_mem_pool_get(char *name)

{
  char *__s;
  int iVar1;
  size_t __n;
  size_t sVar2;
  zt_mem_pool *pool;
  zt_mem_pool *pzVar3;
  
  if ((name != (char *)0x0) &&
     (__n = strlen(name), pzVar3 = (zt_mem_pool *)pools.next, pools.next != &pools)) {
    do {
      __s = pzVar3->name;
      sVar2 = strlen(__s);
      if ((sVar2 == __n) && (iVar1 = strncmp(name,__s,__n), iVar1 == 0)) {
        return pzVar3;
      }
      pzVar3 = (zt_mem_pool *)(pzVar3->pool_list).next;
    } while (pzVar3 != (zt_mem_pool *)&pools);
  }
  return (zt_mem_pool *)0x0;
}

Assistant:

zt_mem_pool *
zt_mem_pool_get(char *name)
{
    size_t       nlen;
    zt_elist_t * tmp;

    if (!name) {
        return 0;
    }

    nlen = strlen(name);

    zt_elist_for_each(&pools, tmp) {
        zt_mem_pool * pool;
        size_t        olen;

        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        olen = strlen(pool->name);

        if (olen == nlen && (strncmp(name, pool->name, nlen) == 0)) {
            return pool;
        }
    }

    return 0;
}